

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O2

string * __thiscall
Dashel::IPV4Address::format_abi_cxx11_
          (string *__return_storage_ptr__,IPV4Address *this,bool resolveName)

{
  uint uVar1;
  hostent *phVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  uint a2;
  ostringstream buf;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  uVar1 = this->address;
  a2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if (((int)CONCAT71(in_register_00000011,resolveName) == 0) ||
     (phVar2 = gethostbyaddr(&a2,4,2), phVar2 == (hostent *)0x0)) {
    uVar1 = a2;
    poVar3 = std::operator<<((ostream *)&buf,"tcp:host=");
    pcVar4 = inet_ntoa((in_addr)uVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,";port=");
    std::ostream::operator<<(poVar3,this->port);
    std::__cxx11::stringbuf::str();
  }
  else {
    poVar3 = std::operator<<((ostream *)&buf,"tcp:host=");
    poVar3 = std::operator<<(poVar3,phVar2->h_name);
    poVar3 = std::operator<<(poVar3,";port=");
    std::ostream::operator<<(poVar3,this->port);
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  return __return_storage_ptr__;
}

Assistant:

std::string IPV4Address::format(const bool resolveName) const
	{
		std::ostringstream buf;
		unsigned a2 = htonl(address);

		if (resolveName)
		{
			struct hostent* he = gethostbyaddr((const char*)&a2, 4, AF_INET);
			if (he != NULL)
			{
				buf << "tcp:host=" << he->h_name << ";port=" << port;
				return buf.str();
			}
		}

		struct in_addr addr;
		addr.s_addr = a2;
		buf << "tcp:host=" << inet_ntoa(addr) << ";port=" << port;
		return buf.str();
	}